

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_digit.c
# Opt level: O2

void njd_set_digit(NJD *njd)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  NJDNode *pNVar4;
  char *pcVar5;
  char *pcVar6;
  _NJDNode *p_Var7;
  uint uVar8;
  NJDNode *pNVar9;
  _NJDNode *p_Var10;
  NJDNode *pNVar11;
  NJD *pNVar12;
  byte bVar13;
  char **ppcVar14;
  long lVar15;
  _NJDNode **pp_Var16;
  uint uVar17;
  NJDNode *node;
  bool bVar18;
  bool bVar19;
  NJDNode *local_48;
  
  p_Var10 = (NJDNode *)0x0;
  bVar18 = false;
  pNVar12 = njd;
  do {
    pNVar11 = pNVar12->head;
    if (pNVar11 == (NJDNode *)0x0) {
      if (bVar18) {
        NJD_remove_silent_node(njd);
        if (njd->head != (NJDNode *)0x0) {
          pp_Var16 = &njd->head->next;
LAB_001711f8:
          do {
            p_Var10 = *pp_Var16;
            while( true ) {
              if ((p_Var10 == (NJDNode *)0x0) || (p_Var10->next == (_NJDNode *)0x0)) {
                pNVar11 = njd->head;
                goto LAB_001713d2;
              }
              pp_Var16 = &p_Var10->next;
              pcVar3 = NJDNode_get_string(p_Var10);
              if (((*pcVar3 == '*') && (pcVar3[1] == '\0')) ||
                 ((pcVar3 = NJDNode_get_string(p_Var10->prev), *pcVar3 == '*' && (pcVar3[1] == '\0')
                  ))) break;
              pcVar3 = NJDNode_get_string(p_Var10);
              iVar1 = is_period(pcVar3);
              if (iVar1 == 0) break;
              pcVar3 = NJDNode_get_pos_group1(p_Var10->prev);
              iVar1 = strcmp(pcVar3,anon_var_dwarf_ec792 + 9);
              if (iVar1 != 0) break;
              pcVar3 = NJDNode_get_pos_group1(*pp_Var16);
              iVar1 = strcmp(pcVar3,anon_var_dwarf_ec792 + 9);
              if (iVar1 != 0) break;
              NJDNode_load(p_Var10,anon_var_dwarf_eab79);
              NJDNode_set_chain_flag(p_Var10,1);
              pcVar3 = NJDNode_get_string(p_Var10->prev);
              iVar1 = strcmp(pcVar3,anon_var_dwarf_eab90);
              if (iVar1 == 0) {
LAB_00171339:
                pNVar11 = p_Var10->prev;
                pcVar3 = anon_var_dwarf_eaba6;
LAB_00171344:
                NJDNode_set_pron(pNVar11,pcVar3);
                NJDNode_set_mora_size(p_Var10->prev,2);
              }
              else {
                pcVar3 = NJDNode_get_string(p_Var10->prev);
                iVar1 = strcmp(pcVar3,anon_var_dwarf_e5cb5);
                if (iVar1 == 0) goto LAB_00171339;
                pcVar3 = NJDNode_get_string(p_Var10->prev);
                iVar1 = strcmp(pcVar3,anon_var_dwarf_eabbd);
                pNVar11 = p_Var10->prev;
                if (iVar1 == 0) {
                  pcVar3 = anon_var_dwarf_ec2d7 + 3;
                  goto LAB_00171344;
                }
                pcVar3 = NJDNode_get_string(pNVar11);
                iVar1 = strcmp(pcVar3,anon_var_dwarf_eabd3);
                pNVar11 = p_Var10->prev;
                if (iVar1 == 0) {
                  pcVar3 = anon_var_dwarf_eabde;
                  goto LAB_00171344;
                }
                pcVar3 = NJDNode_get_string(pNVar11);
                iVar1 = strcmp(pcVar3,anon_var_dwarf_eabe9);
                if (iVar1 == 0) {
                  NJDNode_set_acc(p_Var10->prev,1);
                }
              }
              while (pNVar11 = *pp_Var16, pNVar11 != (NJDNode *)0x0) {
                pcVar3 = NJDNode_get_pos(pNVar11);
                iVar1 = strcmp(pcVar3,anon_var_dwarf_f019c + 0xd);
                pp_Var16 = &pNVar11->next;
                if (iVar1 != 0) goto LAB_001711f8;
              }
              p_Var10 = (NJDNode *)0x0;
            }
          } while( true );
        }
      }
      return;
    }
    bVar19 = !bVar18;
    bVar18 = true;
    if (bVar19) {
      pcVar3 = NJDNode_get_pos_group1(pNVar11);
      iVar1 = strcmp(pcVar3,anon_var_dwarf_ec792 + 9);
      bVar18 = iVar1 == 0;
    }
    iVar1 = get_digit(pNVar11,1);
    if (iVar1 < 0) {
      pcVar3 = NJDNode_get_pos_group1(pNVar11);
      iVar1 = strcmp(pcVar3,anon_var_dwarf_ec792 + 9);
      if (iVar1 == 0) {
        pcVar3 = NJDNode_get_string(pNVar11);
        iVar1 = is_period(pcVar3);
        if (iVar1 == 0) {
          pcVar3 = NJDNode_get_string(pNVar11);
          iVar1 = is_comma(pcVar3);
          if (iVar1 == 0) goto LAB_00170b42;
        }
        goto LAB_00170b08;
      }
LAB_00170b42:
      if (p_Var10 == (NJDNode *)0x0) {
LAB_0017117a:
        p_Var10 = (NJDNode *)0x0;
      }
      else {
        pNVar9 = pNVar11->prev;
        if (pNVar11->prev != (NJDNode *)0x0) goto LAB_00170b66;
      }
    }
    else {
LAB_00170b08:
      if (p_Var10 == (NJDNode *)0x0) {
        p_Var10 = pNVar11;
      }
      pNVar9 = pNVar11;
      if (pNVar11 == njd->tail) {
LAB_00170b66:
        uVar17 = 1;
        if (p_Var10 != (NJDNode *)0x0) {
          pcVar3 = NJDNode_get_string(p_Var10);
          iVar1 = is_comma(pcVar3);
          if (iVar1 == 0) {
            pcVar3 = NJDNode_get_string(p_Var10);
            iVar1 = is_period(pcVar3);
            node = p_Var10;
            if (iVar1 == 0) {
              for (; (node != pNVar9 && (node->next != (NJDNode *)0x0)); node = node->next) {
                pcVar3 = NJDNode_get_string(node->next);
                iVar1 = is_period(pcVar3);
                if (iVar1 != 0) break;
              }
              do {
                bVar19 = node == p_Var10;
                if ((bVar19) || (node->prev == (_NJDNode *)0x0)) goto LAB_00170c06;
                pcVar3 = NJDNode_get_string(node);
                iVar1 = is_comma(pcVar3);
                if (iVar1 == 0) goto code_r0x00170c03;
                node = node->prev;
              } while( true );
            }
          }
          if (p_Var10 != pNVar9) goto LAB_00170bab;
        }
        goto LAB_0017117a;
      }
    }
    pNVar12 = (NJD *)&pNVar11->next;
  } while( true );
LAB_001713d2:
  pNVar11 = pNVar11->next;
  if (pNVar11 == (NJDNode *)0x0) goto LAB_00171605;
  pcVar3 = NJDNode_get_pos_group1(pNVar11->prev);
  iVar1 = strcmp(pcVar3,anon_var_dwarf_ec792 + 9);
  if (iVar1 == 0) {
    pcVar3 = NJDNode_get_pos_group2(pNVar11);
    iVar1 = strcmp(pcVar3,anon_var_dwarf_eabff);
    if (iVar1 != 0) {
      pcVar3 = NJDNode_get_pos_group1(pNVar11);
      iVar1 = strcmp(pcVar3,anon_var_dwarf_eac16);
      if (iVar1 != 0) goto LAB_001713d2;
    }
    iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class1b,pNVar11);
    ppcVar14 = njd_set_digit_rule_conv_table1b;
    if (iVar1 == 0) {
      iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class1c1,pNVar11);
      ppcVar14 = njd_set_digit_rule_conv_table1c1;
      if (iVar1 != 0) goto LAB_0017155b;
      iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class1c2,pNVar11);
      ppcVar14 = njd_set_digit_rule_conv_table1c2;
      if (iVar1 != 0) goto LAB_0017155b;
      iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class1d,pNVar11);
      ppcVar14 = njd_set_digit_rule_conv_table1d;
      if (iVar1 != 0) goto LAB_0017155b;
      iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class1e,pNVar11);
      ppcVar14 = njd_set_digit_rule_conv_table1e;
      if (iVar1 != 0) goto LAB_0017155b;
      iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class1f,pNVar11);
      ppcVar14 = njd_set_digit_rule_conv_table1f;
      if (iVar1 != 0) goto LAB_0017155b;
      iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class1g,pNVar11);
      ppcVar14 = njd_set_digit_rule_conv_table1g;
      if (iVar1 != 0) goto LAB_0017155b;
      iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class1h,pNVar11);
      ppcVar14 = njd_set_digit_rule_conv_table1h;
      if (iVar1 != 0) goto LAB_0017155b;
      iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class1i,pNVar11);
      ppcVar14 = njd_set_digit_rule_conv_table1i;
      if (iVar1 != 0) goto LAB_0017155b;
      iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class1j,pNVar11);
      ppcVar14 = njd_set_digit_rule_conv_table1j;
      if (iVar1 != 0) goto LAB_0017155b;
      iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class1k,pNVar11);
      ppcVar14 = njd_set_digit_rule_conv_table1k;
      if (iVar1 != 0) goto LAB_0017155b;
    }
    else {
LAB_0017155b:
      convert_digit_pron(ppcVar14,pNVar11->prev);
    }
    iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class2b,pNVar11);
    ppcVar14 = njd_set_digit_rule_conv_table2b;
    if (iVar1 == 0) {
      iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class2c,pNVar11);
      ppcVar14 = njd_set_digit_rule_conv_table2c;
      if (iVar1 != 0) goto LAB_001715de;
      iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class2d,pNVar11);
      ppcVar14 = njd_set_digit_rule_conv_table2d;
      if (iVar1 != 0) goto LAB_001715de;
      iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class2e,pNVar11);
      ppcVar14 = njd_set_digit_rule_conv_table2e;
      if (iVar1 != 0) goto LAB_001715de;
      iVar1 = search_numerative_class(njd_set_digit_rule_numerative_class2f,pNVar11);
      ppcVar14 = njd_set_digit_rule_conv_table2f;
      if (iVar1 != 0) goto LAB_001715de;
    }
    else {
LAB_001715de:
      convert_numerative_pron(ppcVar14,pNVar11->prev,pNVar11);
    }
    NJDNode_set_chain_flag(pNVar11->prev,0);
    NJDNode_set_chain_flag(pNVar11,1);
  }
  goto LAB_001713d2;
LAB_00171605:
  pNVar11 = njd->head;
LAB_00171629:
  while (pNVar11 = pNVar11->next, pNVar12 = njd, pNVar11 != (NJDNode *)0x0) {
    pcVar3 = NJDNode_get_pos_group1(pNVar11->prev);
    iVar1 = strcmp(pcVar3,anon_var_dwarf_ec792 + 9);
    if (iVar1 == 0) {
      pcVar3 = NJDNode_get_pos_group1(pNVar11);
      iVar1 = strcmp(pcVar3,anon_var_dwarf_ec792 + 9);
      if (((iVar1 == 0) && (pcVar3 = NJDNode_get_string(pNVar11->prev), pcVar3 != (char *)0x0)) &&
         (pcVar3 = NJDNode_get_string(pNVar11), pcVar3 != (char *)0x0)) {
        lVar15 = 0;
        do {
          if (lVar15 == 0x60) goto LAB_00171753;
          pcVar3 = NJDNode_get_string(pNVar11->prev);
          iVar1 = strcmp(pcVar3,*(char **)((long)njd_set_digit_rule_numeral_list4 + lVar15));
          lVar15 = lVar15 + 8;
        } while (iVar1 != 0);
        lVar15 = 0;
        do {
          if (lVar15 == 0xa0) goto LAB_00171753;
          pcVar3 = NJDNode_get_string(pNVar11);
          iVar1 = strcmp(pcVar3,*(char **)((long)njd_set_digit_rule_numeral_list5 + lVar15));
          lVar15 = lVar15 + 8;
        } while (iVar1 != 0);
        NJDNode_set_chain_flag(pNVar11->prev,0);
        iVar1 = 1;
        goto LAB_001717ab;
      }
      goto LAB_00171665;
    }
  }
  goto LAB_001717cb;
LAB_00171753:
  lVar15 = 0;
  do {
    if (lVar15 == 0xa0) goto LAB_00171665;
    pcVar3 = NJDNode_get_string(pNVar11->prev);
    iVar1 = strcmp(pcVar3,*(char **)((long)njd_set_digit_rule_numeral_list5 + lVar15));
    lVar15 = lVar15 + 8;
  } while (iVar1 != 0);
  lVar15 = 0;
  do {
    if (lVar15 == 0x60) goto LAB_00171665;
    pcVar3 = NJDNode_get_string(pNVar11);
    iVar1 = strcmp(pcVar3,*(char **)((long)njd_set_digit_rule_numeral_list4 + lVar15));
    lVar15 = lVar15 + 8;
  } while (iVar1 != 0);
  iVar1 = 0;
LAB_001717ab:
  NJDNode_set_chain_flag(pNVar11,iVar1);
LAB_00171665:
  iVar1 = search_numerative_class(njd_set_digit_rule_numeral_list8,pNVar11);
  if (iVar1 != 0) {
    convert_digit_pron(njd_set_digit_rule_numeral_list9,pNVar11->prev);
  }
  iVar1 = search_numerative_class(njd_set_digit_rule_numeral_list10,pNVar11);
  if (iVar1 != 0) {
    convert_digit_pron(njd_set_digit_rule_numeral_list11,pNVar11->prev);
  }
  iVar1 = search_numerative_class(njd_set_digit_rule_numeral_list6,pNVar11);
  if (iVar1 != 0) {
    convert_numerative_pron(njd_set_digit_rule_numeral_list7,pNVar11->prev,pNVar11);
  }
  goto LAB_00171629;
LAB_001717cb:
  pNVar11 = pNVar12->head;
  pNVar12 = njd;
  if (pNVar11 != (NJDNode *)0x0) {
    pNVar12 = (NJD *)&pNVar11->next;
    if ((pNVar11->next != (NJDNode *)0x0) &&
       ((pcVar3 = NJDNode_get_string(pNVar11->next), *pcVar3 != '*' || (pcVar3[1] != '\0')))) {
      pcVar3 = NJDNode_get_pos_group1(pNVar11);
      iVar1 = strcmp(pcVar3,anon_var_dwarf_ec792 + 9);
      if (iVar1 == 0) {
        if (pNVar11->prev != (NJDNode *)0x0) {
          pcVar3 = NJDNode_get_pos(pNVar11->prev);
          iVar1 = strcmp(pcVar3,anon_var_dwarf_e92dd);
          if (iVar1 != 0) {
            pcVar3 = NJDNode_get_pos_group1(pNVar11->prev);
            iVar1 = strcmp(pcVar3,anon_var_dwarf_ec792 + 9);
            if (iVar1 == 0) goto LAB_001717cb;
          }
        }
        pcVar3 = NJDNode_get_pos_group2(*(NJDNode **)pNVar12);
        iVar1 = strcmp(pcVar3,anon_var_dwarf_eabff);
        if (iVar1 != 0) {
          pcVar3 = NJDNode_get_pos_group1(*(NJDNode **)pNVar12);
          iVar1 = strcmp(pcVar3,anon_var_dwarf_eac16);
          if (iVar1 != 0) goto LAB_001717cb;
        }
        for (lVar15 = 1; lVar15 != 0x7d; lVar15 = lVar15 + 2) {
          pcVar3 = NJDNode_get_string(*(NJDNode **)pNVar12);
          iVar1 = strcmp(pcVar3,*(char **)(&UNK_001a22c8 + lVar15 * 8));
          if (iVar1 == 0) {
            pcVar3 = NJDNode_get_read(*(NJDNode **)pNVar12);
            iVar1 = strcmp(pcVar3,njd_set_digit_rule_numerative_class3[lVar15]);
            if (iVar1 == 0) {
              lVar15 = 0;
              goto LAB_001718c6;
            }
          }
        }
LAB_00171950:
        pcVar3 = NJDNode_get_string(*(NJDNode **)pNVar12);
        iVar1 = strcmp(pcVar3,anon_var_dwarf_eac38);
        if (iVar1 == 0) {
          for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 2) {
            pcVar3 = NJDNode_get_string(pNVar11);
            iVar1 = strcmp(pcVar3,njd_set_digit_rule_conv_table4[lVar15]);
            if (iVar1 == 0) {
              NJDNode_load(pNVar11,njd_set_digit_rule_conv_table4[lVar15 + 1]);
              NJDNode_set_pron(pNVar11->next,(char *)0x0);
              break;
            }
          }
        }
        pcVar3 = NJDNode_get_string(*(NJDNode **)pNVar12);
        iVar1 = strcmp(pcVar3,anon_var_dwarf_eac43);
        if ((iVar1 == 0) &&
           ((pcVar3 = NJDNode_get_string(pNVar11), *pcVar3 != '*' || (pcVar3[1] != '\0')))) {
          ppcVar14 = njd_set_digit_rule_conv_table5;
          if (pNVar11->prev != (NJDNode *)0x0) {
            pcVar3 = NJDNode_get_string(pNVar11->prev);
            pcVar3 = strstr(pcVar3,anon_var_dwarf_eb4e3 + 3);
            if (pcVar3 == (char *)0x0) goto LAB_00171a7a;
            pcVar3 = NJDNode_get_string(pNVar11);
            iVar1 = strcmp(pcVar3,anon_var_dwarf_eac59);
            if (iVar1 != 0) goto LAB_00171a7a;
            pcVar3 = anon_var_dwarf_eac64;
            goto LAB_00171aae;
          }
LAB_00171a7a:
          for (lVar15 = 1; lVar15 != 0x15; lVar15 = lVar15 + 2) {
            pcVar3 = NJDNode_get_string(pNVar11);
            iVar1 = strcmp(pcVar3,njd_set_digit_rule_conv_table4[lVar15 + 5]);
            if (iVar1 == 0) goto LAB_00171aa7;
          }
        }
        else {
          pcVar3 = NJDNode_get_string(*(NJDNode **)pNVar12);
          iVar1 = strcmp(pcVar3,anon_var_dwarf_eac7b);
          ppcVar14 = njd_set_digit_rule_conv_table6;
          if (iVar1 == 0) {
            for (lVar15 = 1; lVar15 != 0x15; lVar15 = lVar15 + 2) {
              pcVar3 = NJDNode_get_string(pNVar11);
              iVar1 = strcmp(pcVar3,njd_set_digit_rule_conv_table5[lVar15 + 0x15]);
              if (iVar1 == 0) goto LAB_00171aa7;
            }
          }
        }
      }
    }
    goto LAB_001717cb;
  }
  goto LAB_00171aef;
LAB_001718c6:
  if (lVar15 == 8) goto LAB_00171950;
  pcVar3 = NJDNode_get_string(pNVar11);
  iVar1 = strcmp(pcVar3,njd_set_digit_rule_conv_table3[lVar15]);
  if (iVar1 == 0) {
    pcVar3 = njd_set_digit_rule_conv_table3[lVar15 + 1];
    pcVar5 = njd_set_digit_rule_conv_table3[lVar15 + 2];
    NJDNode_set_read(pNVar11,pcVar3);
    NJDNode_set_pron(pNVar11,pcVar3);
    iVar1 = atoi(pcVar5);
    NJDNode_set_acc(pNVar11,iVar1);
    iVar1 = atoi(njd_set_digit_rule_conv_table3[lVar15 + 3]);
    NJDNode_set_mora_size(pNVar11,iVar1);
    goto LAB_00171950;
  }
  lVar15 = lVar15 + 4;
  goto LAB_001718c6;
LAB_00171aa7:
  pcVar3 = ppcVar14[lVar15];
LAB_00171aae:
  NJDNode_load(pNVar11,pcVar3);
  NJDNode_set_pron(*(NJDNode **)pNVar12,(char *)0x0);
  goto LAB_001717cb;
LAB_00171aef:
  pNVar11 = pNVar12->head;
  if (pNVar11 == (NJDNode *)0x0) {
    NJD_remove_silent_node(njd);
    return;
  }
  if (pNVar11->prev == (NJDNode *)0x0) {
LAB_00171b1c:
    if ((pNVar11->next != (_NJDNode *)0x0) && (pNVar11->next->next != (_NJDNode *)0x0)) {
      pp_Var16 = &pNVar11->next;
      pcVar3 = NJDNode_get_string(pNVar11);
      iVar1 = strcmp(pcVar3,anon_var_dwarf_eac86);
      if (iVar1 == 0) {
        pcVar3 = NJDNode_get_string(*pp_Var16);
        iVar1 = strcmp(pcVar3,anon_var_dwarf_eac91);
        if (iVar1 != 0) goto LAB_00171b6b;
        pcVar3 = NJDNode_get_string((*pp_Var16)->next);
        iVar1 = strcmp(pcVar3,anon_var_dwarf_eac43);
        if (iVar1 == 0) {
          pcVar3 = anon_var_dwarf_eac9c;
        }
        else {
          pcVar3 = NJDNode_get_string((*pp_Var16)->next);
          iVar1 = strcmp(pcVar3,anon_var_dwarf_eac7b);
          if (iVar1 != 0) goto LAB_00171d0f;
          pcVar3 = anon_var_dwarf_eacb3;
        }
        goto LAB_00171cf0;
      }
LAB_00171b6b:
      pcVar3 = NJDNode_get_string(pNVar11);
      iVar1 = strcmp(pcVar3,anon_var_dwarf_eabbd);
      if (iVar1 == 0) {
        pcVar3 = NJDNode_get_string(*pp_Var16);
        iVar1 = strcmp(pcVar3,anon_var_dwarf_eac86);
        if (iVar1 == 0) {
          pcVar3 = NJDNode_get_string((*pp_Var16)->next);
          iVar1 = strcmp(pcVar3,anon_var_dwarf_eac43);
          if (iVar1 == 0) {
            pcVar3 = anon_var_dwarf_eacca;
LAB_00171cf0:
            NJDNode_load(pNVar11,pcVar3);
            NJDNode_set_pron(pNVar11->next,(char *)0x0);
          }
          else {
            pcVar3 = NJDNode_get_string((*pp_Var16)->next);
            iVar1 = strcmp(pcVar3,anon_var_dwarf_eac7b);
            if (iVar1 == 0) {
              pcVar3 = anon_var_dwarf_eacd5;
              goto LAB_00171cf0;
            }
            pcVar3 = NJDNode_get_string((*pp_Var16)->next);
            iVar1 = strcmp(pcVar3,anon_var_dwarf_eac91);
            if ((iVar1 != 0) || (pNVar9 = (*pp_Var16)->next->next, pNVar9 == (NJDNode *)0x0))
            goto LAB_00171d0f;
            pcVar3 = NJDNode_get_string(pNVar9);
            iVar1 = strcmp(pcVar3,anon_var_dwarf_eac43);
            if (iVar1 == 0) {
              NJDNode_load(pNVar11,anon_var_dwarf_eace0);
              p_Var10 = pNVar11->next;
              pcVar3 = anon_var_dwarf_eaceb;
            }
            else {
              pcVar3 = NJDNode_get_string((*pp_Var16)->next->next);
              iVar1 = strcmp(pcVar3,anon_var_dwarf_eac7b);
              if (iVar1 != 0) goto LAB_00171d0f;
              NJDNode_load(pNVar11,anon_var_dwarf_eace0);
              p_Var10 = pNVar11->next;
              pcVar3 = anon_var_dwarf_ead02;
            }
            NJDNode_load(p_Var10,pcVar3);
            NJDNode_set_pron(pNVar11->next->next,(char *)0x0);
            pp_Var16 = &pNVar11->next->next;
          }
          NJDNode_set_pron((*pp_Var16)->next,(char *)0x0);
        }
      }
    }
  }
  else {
    pcVar3 = NJDNode_get_pos_group1(pNVar11->prev);
    iVar1 = strcmp(pcVar3,anon_var_dwarf_ec792 + 9);
    if (iVar1 != 0) goto LAB_00171b1c;
  }
LAB_00171d0f:
  pNVar12 = (NJD *)&pNVar11->next;
  goto LAB_00171aef;
code_r0x00170c03:
  bVar19 = false;
LAB_00170c06:
  iVar1 = 0;
  local_48 = (NJDNode *)0x0;
  uVar8 = 0;
  p_Var7 = node;
  while( true ) {
    pcVar3 = NJDNode_get_string(p_Var7);
    iVar2 = is_comma(pcVar3);
    if (iVar2 == 0) {
      if (uVar17 == 0) {
        uVar17 = 0;
      }
      else {
        uVar17 = (uint)((~uVar8 & 3) != 0);
      }
    }
    else {
      iVar1 = iVar1 + 1;
      local_48 = p_Var7;
      if (uVar17 == 0) {
        uVar17 = 0;
      }
      else {
        uVar17 = (uint)((~uVar8 & 3) == 0);
      }
    }
    if (p_Var7 == p_Var10) break;
    p_Var7 = p_Var7->prev;
    uVar8 = uVar8 + 1;
  }
  if (!bVar19) {
    iVar2 = get_digit(p_Var10,0);
    uVar17 = uVar17 | -(uint)(iVar2 == 0);
  }
  if (uVar17 == 1 && iVar1 == 0) {
    uVar17 = 0;
  }
  if (uVar17 == 1) {
    pNVar4 = p_Var10;
    if (0 < iVar1) {
      while (pNVar4 != node) {
        pcVar3 = NJDNode_get_string(pNVar4);
        iVar1 = is_comma(pcVar3);
        if (iVar1 == 0) {
          pNVar4 = pNVar4->next;
        }
        else {
          pNVar4 = NJD_remove_node(njd,pNVar4);
        }
      }
    }
    convert_digit_sequence_for_numerical_reading(p_Var10,node);
    goto joined_r0x00170d3e;
  }
  if (local_48 != (NJDNode *)0x0) {
    node = local_48->prev;
  }
  if (uVar17 == 0) {
    if (p_Var10->prev == (NJDNode *)0x0) {
      uVar17 = 0;
    }
    else {
      pcVar3 = NJDNode_get_pos_group1(p_Var10->prev);
      pcVar5 = NJDNode_get_pos_group2(p_Var10->prev);
      pcVar6 = NJDNode_get_string(p_Var10->prev);
      iVar1 = strcmp(pcVar3,anon_var_dwarf_eb05e);
      uVar17 = (uint)(iVar1 == 0) * 2;
      iVar1 = strcmp(pcVar5,anon_var_dwarf_eabff);
      if ((iVar1 == 0) || (iVar1 = strcmp(pcVar3,anon_var_dwarf_eac16), iVar1 == 0)) {
        uVar17 = uVar17 | 1;
      }
      uVar8 = uVar17;
      if (pcVar6 != (char *)0x0) {
        iVar1 = is_period(pcVar6);
        if (iVar1 == 0) {
          iVar1 = strcmp(pcVar6,anon_var_dwarf_eb068);
          if ((((iVar1 != 0) && (iVar1 = strcmp(pcVar6,anon_var_dwarf_e5c79), iVar1 != 0)) &&
              (iVar1 = strcmp(pcVar6,anon_var_dwarf_eb07c), iVar1 != 0)) &&
             ((iVar1 = strcmp(pcVar6,anon_var_dwarf_eb086), iVar1 != 0 &&
              (iVar1 = strcmp(pcVar6,anon_var_dwarf_eb090), iVar1 != 0)))) {
            iVar1 = strcmp(pcVar6,anon_var_dwarf_e5c15);
            if (iVar1 == 0) {
              pNVar4 = p_Var10->prev->prev;
              if (pNVar4 == (NJDNode *)0x0) goto LAB_00170f9e;
              pcVar6 = NJDNode_get_pos_group1(pNVar4);
              pcVar3 = anon_var_dwarf_ec792 + 9;
            }
            else {
              iVar1 = strcmp(pcVar6,anon_var_dwarf_e5c29);
              if (iVar1 == 0) goto LAB_00170f9b;
              pcVar3 = anon_var_dwarf_eb0ae;
            }
            iVar1 = strcmp(pcVar6,pcVar3);
            uVar8 = uVar17 - 2;
            goto LAB_00170eec;
          }
LAB_00170f9b:
          uVar8 = uVar17 - 2;
        }
        else {
          pNVar4 = p_Var10->prev->prev;
          if (pNVar4 != (NJDNode *)0x0) {
            pcVar3 = NJDNode_get_pos_group1(pNVar4);
            iVar1 = strcmp(pcVar3,anon_var_dwarf_ec792 + 9);
            uVar8 = uVar17 - 5;
LAB_00170eec:
            if (iVar1 != 0) {
              uVar8 = uVar17;
            }
          }
        }
      }
LAB_00170f9e:
      pNVar4 = p_Var10->prev->prev;
      uVar17 = uVar8;
      if (pNVar4 != (NJDNode *)0x0) {
        pcVar3 = NJDNode_get_string(pNVar4);
        iVar1 = strcmp(pcVar3,anon_var_dwarf_eb0ae);
        uVar17 = uVar8 - 2;
        if (iVar1 != 0) {
          uVar17 = uVar8;
        }
      }
    }
    uVar8 = uVar17;
    if (node->next != (NJDNode *)0x0) {
      pcVar3 = NJDNode_get_pos_group1(node->next);
      pcVar5 = NJDNode_get_pos_group2(node->next);
      pcVar6 = NJDNode_get_string(node->next);
      iVar1 = strcmp(pcVar5,anon_var_dwarf_eabff);
      if ((iVar1 == 0) || (iVar1 = strcmp(pcVar3,anon_var_dwarf_eac16), iVar1 == 0)) {
        uVar17 = uVar17 + 2;
      }
      uVar8 = uVar17;
      if (pcVar6 != (char *)0x0) {
        iVar1 = strcmp(pcVar6,anon_var_dwarf_eb068);
        if ((((iVar1 == 0) || (iVar1 = strcmp(pcVar6,anon_var_dwarf_e5c79), iVar1 == 0)) ||
            (iVar1 = strcmp(pcVar6,anon_var_dwarf_eb07c), iVar1 == 0)) ||
           (((iVar1 = strcmp(pcVar6,anon_var_dwarf_eb086), iVar1 == 0 ||
             (iVar1 = strcmp(pcVar6,anon_var_dwarf_eb090), iVar1 == 0)) ||
            (iVar1 = strcmp(pcVar6,anon_var_dwarf_e5c15), iVar1 == 0)))) {
LAB_001710e6:
          uVar8 = uVar17 - 2;
        }
        else {
          iVar1 = strcmp(pcVar6,anon_var_dwarf_e5c29);
          if (iVar1 == 0) {
            pNVar4 = node->next->next;
            if (pNVar4 != (NJDNode *)0x0) {
              pcVar3 = NJDNode_get_pos_group1(pNVar4);
              iVar1 = strcmp(pcVar3,anon_var_dwarf_ec792 + 9);
              uVar8 = uVar17 - 2;
              if (iVar1 != 0) {
                uVar8 = uVar17;
              }
            }
          }
          else {
            iVar1 = strcmp(pcVar6,anon_var_dwarf_eb0ae);
            if (iVar1 == 0) goto LAB_001710e6;
            iVar1 = is_period(pcVar6);
            uVar8 = uVar17 + 4;
            if (iVar1 == 0) {
              uVar8 = uVar17;
            }
          }
        }
      }
    }
    if (-1 < (int)uVar8) {
      convert_digit_sequence_for_numerical_reading(p_Var10,node);
      goto joined_r0x00170d3e;
    }
  }
  pNVar4 = node->next;
  uVar17 = 0;
  for (p_Var7 = p_Var10; p_Var7 != pNVar4; p_Var7 = p_Var7->next) {
    uVar17 = uVar17 + 1;
  }
  if (1 < uVar17) {
    bVar13 = 0;
    for (; p_Var10 != pNVar4; p_Var10 = p_Var10->next) {
      pcVar3 = NJDNode_get_string(p_Var10);
      iVar1 = strcmp(pcVar3,anon_var_dwarf_eab90);
      pcVar3 = anon_var_dwarf_eb0b8;
      if (iVar1 == 0) {
LAB_00170dde:
        NJDNode_set_pron(p_Var10,pcVar3);
        NJDNode_set_mora_size(p_Var10,2);
      }
      else {
        pcVar3 = NJDNode_get_string(p_Var10);
        iVar1 = strcmp(pcVar3,anon_var_dwarf_e5cb5);
        pcVar3 = anon_var_dwarf_eb0b8;
        if (iVar1 == 0) goto LAB_00170dde;
        pcVar3 = NJDNode_get_string(p_Var10);
        iVar1 = strcmp(pcVar3,anon_var_dwarf_eabbd);
        pcVar3 = anon_var_dwarf_ec2d7 + 3;
        if (iVar1 == 0) goto LAB_00170dde;
        pcVar3 = NJDNode_get_string(p_Var10);
        iVar1 = strcmp(pcVar3,anon_var_dwarf_eabd3);
        pcVar3 = anon_var_dwarf_eabde;
        if (iVar1 == 0) goto LAB_00170dde;
      }
      NJDNode_set_chain_rule(p_Var10,(char *)0x0);
      if ((bool)(bVar13 & 1)) {
        NJDNode_set_chain_flag(p_Var10,1);
        NJDNode_set_acc(p_Var10->prev,3);
      }
      else {
        NJDNode_set_chain_flag(p_Var10,0);
      }
      bVar13 = bVar13 + 1;
      pNVar4 = node->next;
    }
  }
joined_r0x00170d3e:
  p_Var10 = node;
  if (p_Var10 == pNVar9) goto LAB_0017117a;
LAB_00170bab:
  p_Var10 = p_Var10->next;
  goto LAB_00170b66;
}

Assistant:

void njd_set_digit(NJD * njd)
{
   int i, j;
   NJDNode *s = NULL;
   NJDNode *e = NULL;
   NJDNode *node;
   int find = 0;

   /* convert digit sequence */
   for (node = njd->head; node != NULL; node = node->next) {
      if (find == 0 && strcmp(NJDNode_get_pos_group1(node), NJD_SET_DIGIT_KAZU) == 0)
         find = 1;
      if (get_digit(node, 1) >= 0 ||
          (strcmp(NJDNode_get_pos_group1(node), NJD_SET_DIGIT_KAZU) == 0 &&
           (is_period(NJDNode_get_string(node)) == 1 || is_comma(NJDNode_get_string(node)) == 1)
          )) {
         if (s == NULL)
            s = node;
         if (node == njd->tail)
            e = node;
      } else {
         if (s != NULL)
            e = node->prev;
      }
      if (s != NULL && e != NULL) {
         convert_digit_sequence(njd, s, e);
         s = e = NULL;
      }
   }
   if (find == 0)
      return;
   NJD_remove_silent_node(njd);
   if (njd->head == NULL)
      return;

   for (node = njd->head->next; node != NULL && node->next != NULL;) {
      if (strcmp(NJDNode_get_string(node), "*") != 0
          && strcmp(NJDNode_get_string(node->prev), "*") != 0
          && is_period(NJDNode_get_string(node)) == 1
          && strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_DIGIT_KAZU) == 0
          && strcmp(NJDNode_get_pos_group1(node->next), NJD_SET_DIGIT_KAZU) == 0) {
         NJDNode_load(node, NJD_SET_DIGIT_TEN_FEATURE);
         NJDNode_set_chain_flag(node, 1);
         if (strcmp(NJDNode_get_string(node->prev), NJD_SET_DIGIT_ZERO1) == 0
             || strcmp(NJDNode_get_string(node->prev), NJD_SET_DIGIT_ZERO2) == 0) {
            NJDNode_set_pron(node->prev, NJD_SET_DIGIT_ZERO_BEFORE_DP);
            NJDNode_set_mora_size(node->prev, 2);
         } else if (strcmp(NJDNode_get_string(node->prev), NJD_SET_DIGIT_TWO) == 0) {
            NJDNode_set_pron(node->prev, NJD_SET_DIGIT_TWO_BEFORE_DP);
            NJDNode_set_mora_size(node->prev, 2);
         } else if (strcmp(NJDNode_get_string(node->prev), NJD_SET_DIGIT_FIVE) == 0) {
            NJDNode_set_pron(node->prev, NJD_SET_DIGIT_FIVE_BEFORE_DP);
            NJDNode_set_mora_size(node->prev, 2);
         } else if (strcmp(NJDNode_get_string(node->prev), NJD_SET_DIGIT_SIX) == 0) {
            NJDNode_set_acc(node->prev, 1);
         }
         /* skip digit sequence */
         node = node->next;
         while (node && strcmp(NJDNode_get_pos(node), NJD_SET_DIGIT_MEISHI) == 0)
            node = node->next;
         if (node)
            node = node->next;
      } else {
         node = node->next;
      }
   }

   for (node = njd->head->next; node != NULL; node = node->next) {
      if (strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_DIGIT_KAZU) == 0) {
         if (strcmp(NJDNode_get_pos_group2(node), NJD_SET_DIGIT_JOSUUSHI) == 0
             || strcmp(NJDNode_get_pos_group1(node), NJD_SET_DIGIT_FUKUSHIKANOU) == 0) {
            /* convert digit pron */
            if (search_numerative_class(njd_set_digit_rule_numerative_class1b, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1b, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1c1, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1c1, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1c2, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1c2, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1d, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1d, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1e, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1e, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1f, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1f, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1g, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1g, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1h, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1h, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1i, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1i, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1j, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1j, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1k, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1k, node->prev);
            /* convert numerative pron */
            if (search_numerative_class(njd_set_digit_rule_numerative_class2b, node) == 1)
               convert_numerative_pron(njd_set_digit_rule_conv_table2b, node->prev, node);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class2c, node) == 1)
               convert_numerative_pron(njd_set_digit_rule_conv_table2c, node->prev, node);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class2d, node) == 1)
               convert_numerative_pron(njd_set_digit_rule_conv_table2d, node->prev, node);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class2e, node) == 1)
               convert_numerative_pron(njd_set_digit_rule_conv_table2e, node->prev, node);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class2f, node) == 1)
               convert_numerative_pron(njd_set_digit_rule_conv_table2f, node->prev, node);
            /* modify accent phrase */
            NJDNode_set_chain_flag(node->prev, 0);
            NJDNode_set_chain_flag(node, 1);
         }
      }
   }

   for (node = njd->head->next; node != NULL; node = node->next) {
      if (strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_DIGIT_KAZU) == 0) {
         if (strcmp(NJDNode_get_pos_group1(node), NJD_SET_DIGIT_KAZU) == 0
             && NJDNode_get_string(node->prev) != NULL && NJDNode_get_string(node) != NULL) {
            /* modify accent phrase */
            find = 0;
            for (i = 0; njd_set_digit_rule_numeral_list4[i] != NULL; i++) {
               if (strcmp(NJDNode_get_string(node->prev), njd_set_digit_rule_numeral_list4[i]) == 0) {
                  for (j = 0; njd_set_digit_rule_numeral_list5[j] != NULL; j++) {
                     if (strcmp(NJDNode_get_string(node), njd_set_digit_rule_numeral_list5[j]) == 0) {
                        NJDNode_set_chain_flag(node->prev, 0);
                        NJDNode_set_chain_flag(node, 1);
                        find = 1;
                        break;
                     }
                  }
                  break;
               }
            }
            if (find == 0) {
               for (i = 0; njd_set_digit_rule_numeral_list5[i] != NULL; i++) {
                  if (strcmp(NJDNode_get_string(node->prev), njd_set_digit_rule_numeral_list5[i]) ==
                      0) {
                     for (j = 0; njd_set_digit_rule_numeral_list4[j] != NULL; j++) {
                        if (strcmp(NJDNode_get_string(node), njd_set_digit_rule_numeral_list4[j]) ==
                            0) {
                           NJDNode_set_chain_flag(node, 0);
                           break;
                        }
                     }
                     break;
                  }
               }
            }
         }
         if (search_numerative_class(njd_set_digit_rule_numeral_list8, node) == 1)
            convert_digit_pron(njd_set_digit_rule_numeral_list9, node->prev);
         if (search_numerative_class(njd_set_digit_rule_numeral_list10, node) == 1)
            convert_digit_pron(njd_set_digit_rule_numeral_list11, node->prev);
         if (search_numerative_class(njd_set_digit_rule_numeral_list6, node) == 1)
            convert_numerative_pron(njd_set_digit_rule_numeral_list7, node->prev, node);
      }
   }

   for (node = njd->head; node != NULL; node = node->next) {
      if (node->next != NULL &&
          strcmp(NJDNode_get_string(node->next), "*") != 0 &&
          strcmp(NJDNode_get_pos_group1(node), NJD_SET_DIGIT_KAZU) == 0 &&
          (node->prev == NULL
           || strcmp(NJDNode_get_pos(node->prev), NJD_SET_DIGIT_KIGOU) == 0
           || strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_DIGIT_KAZU) != 0)
          && (strcmp(NJDNode_get_pos_group2(node->next), NJD_SET_DIGIT_JOSUUSHI) == 0
              || strcmp(NJDNode_get_pos_group1(node->next), NJD_SET_DIGIT_FUKUSHIKANOU) == 0)) {
         /* convert class3 */
         for (i = 0; njd_set_digit_rule_numerative_class3[i] != NULL; i += 2) {
            if (strcmp(NJDNode_get_string(node->next), njd_set_digit_rule_numerative_class3[i]) == 0
                && strcmp(NJDNode_get_read(node->next),
                          njd_set_digit_rule_numerative_class3[i + 1]) == 0) {
               for (j = 0; njd_set_digit_rule_conv_table3[j] != NULL; j += 4) {
                  if (strcmp(NJDNode_get_string(node), njd_set_digit_rule_conv_table3[j]) == 0) {
                     NJDNode_set_read(node, (char *) njd_set_digit_rule_conv_table3[j + 1]);
                     NJDNode_set_pron(node, (char *) njd_set_digit_rule_conv_table3[j + 1]);
                     NJDNode_set_acc(node, atoi(njd_set_digit_rule_conv_table3[j + 2]));
                     NJDNode_set_mora_size(node, atoi(njd_set_digit_rule_conv_table3[j + 3]));
                     break;
                  }
               }
               break;
            }
         }
         /* person */
         if (strcmp(NJDNode_get_string(node->next), NJD_SET_DIGIT_NIN) == 0) {
            for (i = 0; njd_set_digit_rule_conv_table4[i] != NULL; i += 2) {
               if (strcmp(NJDNode_get_string(node), njd_set_digit_rule_conv_table4[i]) == 0) {
                  NJDNode_load(node, (char *) njd_set_digit_rule_conv_table4[i + 1]);
                  NJDNode_set_pron(node->next, NULL);
                  break;
               }
            }
         }
         /* the day of month */
         if (strcmp(NJDNode_get_string(node->next), NJD_SET_DIGIT_NICHI) == 0
             && strcmp(NJDNode_get_string(node), "*") != 0) {
            if (node->prev != NULL
                && strstr(NJDNode_get_string(node->prev), NJD_SET_DIGIT_GATSU) != NULL
                && strcmp(NJDNode_get_string(node), NJD_SET_DIGIT_ONE) == 0) {
               NJDNode_load(node, NJD_SET_DIGIT_TSUITACHI);
               NJDNode_set_pron(node->next, NULL);
            } else {
               for (i = 0; njd_set_digit_rule_conv_table5[i] != NULL; i += 2) {
                  if (strcmp(NJDNode_get_string(node), njd_set_digit_rule_conv_table5[i]) == 0) {
                     NJDNode_load(node, (char *) njd_set_digit_rule_conv_table5[i + 1]);
                     NJDNode_set_pron(node->next, NULL);
                     break;
                  }
               }
            }
         } else if (strcmp(NJDNode_get_string(node->next), NJD_SET_DIGIT_NICHIKAN) == 0) {
            for (i = 0; njd_set_digit_rule_conv_table6[i] != NULL; i += 2) {
               if (strcmp(NJDNode_get_string(node), njd_set_digit_rule_conv_table6[i]) == 0) {
                  NJDNode_load(node, (char *) njd_set_digit_rule_conv_table6[i + 1]);
                  NJDNode_set_pron(node->next, NULL);
                  break;
               }
            }
         }
      }
   }

   for (node = njd->head; node != NULL; node = node->next) {
      if ((node->prev == NULL
           || strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_DIGIT_KAZU) != 0)
          && node->next != NULL && node->next->next != NULL) {
         if (strcmp(NJDNode_get_string(node), NJD_SET_DIGIT_TEN) == 0
             && strcmp(NJDNode_get_string(node->next), NJD_SET_DIGIT_FOUR) == 0) {
            if (strcmp(NJDNode_get_string(node->next->next), NJD_SET_DIGIT_NICHI) == 0) {
               NJDNode_load(node, NJD_SET_DIGIT_JUYOKKA);
               NJDNode_set_pron(node->next, NULL);
               NJDNode_set_pron(node->next->next, NULL);
            } else if (strcmp(NJDNode_get_string(node->next->next), NJD_SET_DIGIT_NICHIKAN) == 0) {
               NJDNode_load(node, NJD_SET_DIGIT_JUYOKKAKAN);
               NJDNode_set_pron(node->next, NULL);
               NJDNode_set_pron(node->next->next, NULL);
            }
         } else if (strcmp(NJDNode_get_string(node), NJD_SET_DIGIT_TWO) == 0
                    && strcmp(NJDNode_get_string(node->next), NJD_SET_DIGIT_TEN) == 0) {
            if (strcmp(NJDNode_get_string(node->next->next), NJD_SET_DIGIT_NICHI) == 0) {
               NJDNode_load(node, NJD_SET_DITIT_HATSUKA);
               NJDNode_set_pron(node->next, NULL);
               NJDNode_set_pron(node->next->next, NULL);
            } else if (strcmp(NJDNode_get_string(node->next->next), NJD_SET_DIGIT_NICHIKAN) == 0) {
               NJDNode_load(node, NJD_SET_DIGIT_HATSUKAKAN);
               NJDNode_set_pron(node->next, NULL);
               NJDNode_set_pron(node->next->next, NULL);
            } else if (strcmp(NJDNode_get_string(node->next->next), NJD_SET_DIGIT_FOUR) == 0
                       && node->next->next->next != NULL) {
               if (strcmp(NJDNode_get_string(node->next->next->next), NJD_SET_DIGIT_NICHI) == 0) {
                  NJDNode_load(node, NJD_SET_DIGIT_NIJU);
                  NJDNode_load(node->next, NJD_SET_DITIT_YOKKA);
                  NJDNode_set_pron(node->next->next, NULL);
                  NJDNode_set_pron(node->next->next->next, NULL);
               } else if (strcmp(NJDNode_get_string(node->next->next->next), NJD_SET_DIGIT_NICHIKAN)
                          == 0) {
                  NJDNode_load(node, NJD_SET_DIGIT_NIJU);
                  NJDNode_load(node->next, NJD_SET_DIGIT_YOKKAKAN);
                  NJDNode_set_pron(node->next->next, NULL);
                  NJDNode_set_pron(node->next->next->next, NULL);
               }
            }
         }
      }
   }

   NJD_remove_silent_node(njd);
   if (njd->head == NULL)
      return;
}